

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStructCmpxchg
          (InternalAnalyzer *this,StructCmpxchg *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  
  bVar2 = Type::isNull((Type *)(*(long *)(curr + 0x18) + 8));
  pEVar1 = this->parent;
  if (bVar2) {
    pEVar1->trap = true;
  }
  else {
    pEVar1->readsMutableStruct = true;
    pEVar1->writesStruct = true;
    if (((uint)*(ulong *)(*(long *)(curr + 0x18) + 8) & 3) == 2 &&
        6 < *(ulong *)(*(long *)(curr + 0x18) + 8)) {
      pEVar1->implicitTrap = true;
    }
    if (*(int *)(curr + 0x30) == 0) {
      __assert_fail("curr->order != MemoryOrder::Unordered",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/effects.h"
                    ,0x39d,
                    "void wasm::EffectAnalyzer::InternalAnalyzer::visitStructCmpxchg(StructCmpxchg *)"
                   );
    }
    pEVar1->isAtomic = true;
  }
  return;
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsMutableStruct = true;
      parent.writesStruct = true;
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
      assert(curr->order != MemoryOrder::Unordered);
      parent.isAtomic = true;
    }